

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decodeFrameHeader(ZSTD_DCtx *dctx,void *src,size_t headerSize)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar2 = ZSTD_getFrameHeader_advanced(&dctx->fParams,src,headerSize,dctx->format);
  sVar3 = sVar2;
  if ((sVar2 < 0xffffffffffffff89) && (sVar3 = 0xffffffffffffffb8, sVar2 == 0)) {
    if ((dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) &&
       (dctx->ddictSet != (ZSTD_DDictHashSet *)0x0)) {
      ZSTD_DCtx_selectFrameDDict(dctx);
    }
    uVar1 = (dctx->fParams).dictID;
    if ((uVar1 == 0) || (sVar3 = 0xffffffffffffffe0, dctx->dictID == uVar1)) {
      if ((dctx->fParams).checksumFlag == 0) {
        dctx->validateChecksum = 0;
      }
      else {
        bVar4 = dctx->forceIgnoreChecksum == ZSTD_d_validateChecksum;
        dctx->validateChecksum = (uint)bVar4;
        if (bVar4) {
          (dctx->xxhState).total_len = 0;
          (dctx->xxhState).v[0] = 0;
          (dctx->xxhState).v[1] = 0;
          (dctx->xxhState).v[2] = 0;
          (dctx->xxhState).v[3] = 0;
          (dctx->xxhState).mem64[0] = 0;
          (dctx->xxhState).mem64[3] = 0;
          (dctx->xxhState).memsize = 0;
          (dctx->xxhState).reserved32 = 0;
          (dctx->xxhState).mem64[1] = 0;
          (dctx->xxhState).mem64[2] = 0;
          (dctx->xxhState).reserved64 = 0;
          (dctx->xxhState).v[0] = 0x60ea27eeadc0b5d6;
          (dctx->xxhState).v[1] = 0xc2b2ae3d27d4eb4f;
          (dctx->xxhState).v[3] = 0x61c8864e7a143579;
        }
      }
      dctx->processedCSize = dctx->processedCSize + headerSize;
      sVar3 = 0;
    }
  }
  return sVar3;
}

Assistant:

static size_t ZSTD_decodeFrameHeader(ZSTD_DCtx* dctx, const void* src, size_t headerSize)
{
    size_t const result = ZSTD_getFrameHeader_advanced(&(dctx->fParams), src, headerSize, dctx->format);
    if (ZSTD_isError(result)) return result;    /* invalid header */
    RETURN_ERROR_IF(result>0, srcSize_wrong, "headerSize too small");

    /* Reference DDict requested by frame if dctx references multiple ddicts */
    if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts && dctx->ddictSet) {
        ZSTD_DCtx_selectFrameDDict(dctx);
    }

#ifndef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /* Skip the dictID check in fuzzing mode, because it makes the search
     * harder.
     */
    RETURN_ERROR_IF(dctx->fParams.dictID && (dctx->dictID != dctx->fParams.dictID),
                    dictionary_wrong, "");
#endif
    dctx->validateChecksum = (dctx->fParams.checksumFlag && !dctx->forceIgnoreChecksum) ? 1 : 0;
    if (dctx->validateChecksum) XXH64_reset(&dctx->xxhState, 0);
    dctx->processedCSize += headerSize;
    return 0;
}